

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replay.cpp
# Opt level: O0

bool __thiscall Replay::skip_until_nmi(Replay *this,uint32_t target_skip_nmi)

{
  bool bVar1;
  char *__filename;
  size_t in_RCX;
  size_t __nbytes;
  uint64_t helper_pos;
  undefined1 auStack_c7 [3];
  int bank;
  TraceSkip msg;
  uint64_t skip;
  undefined1 local_90 [4];
  uint32_t nmi_per_skip;
  TraceCacheHeader header;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [8];
  string filename;
  undefined1 local_38 [8];
  BigFile f;
  EmulateRegisters *regs;
  uint32_t target_skip_nmi_local;
  Replay *this_local;
  
  f._file = (FILE *)&this->regs;
  snestistics::BigFile::BigFile((BigFile *)local_38);
  std::operator+(local_58,(char *)&this->_trace_file_name);
  __filename = (char *)std::__cxx11::string::c_str();
  f._offset = (uint64_t)fopen(__filename,"rb");
  std::__cxx11::string::~string((string *)local_58);
  if (f._offset != 0) {
    snestistics::TraceCacheHeader::TraceCacheHeader((TraceCacheHeader *)local_90);
    snestistics::BigFile::read((BigFile *)local_38,(int)local_90,(void *)0x2c,in_RCX);
    if ((int)header.magic == 4) {
      if (target_skip_nmi < (uint)header.trace_file_content_guid._4_4_) {
        printf("Emulation cache does not have enough NMIs, not using\n");
        fclose((FILE *)f._offset);
      }
      else {
        msg.regs._11_8_ = (ulong)target_skip_nmi / (ulong)(uint)header.trace_file_content_guid._0_4_
        ;
        snestistics::BigFile::set_offset
                  ((BigFile *)local_38,msg.regs._11_8_ * 0x20027 + header.trace_summary_seek_offset)
        ;
        snestistics::BigFile::read((BigFile *)local_38,(int)auStack_c7,(void *)0x27,in_RCX);
        if (target_skip_nmi < _auStack_c7) {
          __assert_fail("msg.nmi <= target_skip_nmi",
                        "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/replay.cpp"
                        ,0xa8,"bool Replay::skip_until_nmi(const uint32_t)");
        }
        *(undefined2 *)(f._file + 8) = msg.current_op._6_2_;
        *(uint16_t *)(f._file + 10) = msg.regs.P;
        *(uint16_t *)(f._file + 0xc) = msg.regs.A;
        *(uint16_t *)(f._file + 0x10) = msg.regs.wram_address;
        f._file[0x14] = msg.regs.S._0_1_;
        *(uint16_t *)(f._file + 0x12) = msg.regs.pc_address;
        *(uint *)(f._file + 4) = (uint)CONCAT12((undefined1)msg.regs.DP,(undefined2)msg.current_op);
        *(undefined2 *)(f._file + 0xe) = msg.current_op._4_2_;
        __nbytes = (size_t)(uint)CONCAT12(msg.regs.DP._1_1_,msg.current_op._2_2_);
        *(uint *)(f._file + 0x18) = (uint)CONCAT12(msg.regs.DP._1_1_,msg.current_op._2_2_);
        for (helper_pos._4_4_ = 0; helper_pos._4_4_ < 0x100; helper_pos._4_4_ = helper_pos._4_4_ + 1
            ) {
          memset((void *)(*(long *)(f._file + 0x20) + (long)(helper_pos._4_4_ << 0x10)),0,0x8000);
        }
        snestistics::BigFile::read
                  ((BigFile *)local_38,(int)*(undefined8 *)(f._file + 0x20) + 0x7e0000,
                   (void *)0x10000,__nbytes);
        snestistics::BigFile::read
                  ((BigFile *)local_38,(int)*(undefined8 *)(f._file + 0x20) + 0x7f0000,
                   (void *)0x10000,__nbytes);
        if ((ulong)_auStack_c7 !=
            msg.regs._11_8_ * (ulong)(uint)header.trace_file_content_guid._0_4_) {
          __assert_fail("msg.nmi == skip * nmi_per_skip",
                        "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/replay.cpp"
                        ,0xbb,"bool Replay::skip_until_nmi(const uint32_t)");
        }
        this->_current_nmi = _auStack_c7;
        snestistics::BigFile::set_offset(&this->_trace_file,stack0xffffffffffffff3d);
        this->_current_op = msg.seek_offset_trace_file;
        this->_accumulated_op_counter = msg.seek_offset_trace_file - 1;
        read_next_event(this);
        if ((this->_trace_helper)._file != (FILE *)0x0) {
          snestistics::BigFile::set_offset(&this->_trace_helper,this->_current_op * 0x2f);
        }
        fclose((FILE *)f._offset);
      }
    }
    else {
      printf("Emulation cache has wrong version, not using\n");
      fclose((FILE *)f._offset);
    }
  }
  if (target_skip_nmi < this->_current_nmi) {
    __assert_fail("_current_nmi <= target_skip_nmi",
                  "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/replay.cpp"
                  ,0xce,"bool Replay::skip_until_nmi(const uint32_t)");
  }
  if (this->_current_nmi == target_skip_nmi) {
    this_local._7_1_ = true;
  }
  else {
    do {
      if (((target_skip_nmi == this->_current_nmi) && (this->_current_op == this->_next_event_op))
         && ((this->_next_event).type == EVENT_NMI)) {
        return true;
      }
      bVar1 = next(this);
    } while (bVar1);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Replay::skip_until_nmi(const uint32_t target_skip_nmi) {

	EmulateRegisters &regs = this->regs;

	// TODO: If we are running without skip-cache we can't go back! Fix, or require skip cache...

	// Use skip file if it exists!
	// Note: Currently we can only skip to the point right AFTER an NMI so we do one nmi too little here
	// Using do/while here is a bit bananas but helps with indentation :)
	do {
		BigFile f;
		{
			std::string filename = _trace_file_name + ".emulation_cache";
			f._file = fopen(filename.c_str(), "rb"); // The 0 here must be wrong if we do many
		}
		if (!f._file)
			break;

		snestistics::TraceCacheHeader header;
		f.read(&header, sizeof(header));

		// TODO: Test again trace hash as well for sanity?

		if (header.version != TRACE_CACHE_VERSION) {
			printf("Emulation cache has wrong version, not using\n");
			fclose(f._file);
			break;
		}

		if(target_skip_nmi < header.num_nmis) {
			printf("Emulation cache does not have enough NMIs, not using\n");
			fclose(f._file);
			break;
		}

		const uint32_t nmi_per_skip = header.nmi_per_skip;

		// Since skip information is to get AFTER an nmi just happened, we skip to the frame before
		// We use emulation to get to the before NMI case
		uint64_t skip = (target_skip_nmi) / nmi_per_skip;
		f.set_offset(skip * snestistics::trace_skip_total_size + header.replay_cache_seek_offset);

		snestistics::TraceSkip msg;
		f.read(&msg, sizeof(msg));
		assert(msg.nmi <= target_skip_nmi);

		// TODO: Don't leak STATE implementation like this
		regs._A  = msg.regs.A;
		regs._X  = msg.regs.X;
		regs._Y  = msg.regs.Y;
		regs._S  = msg.regs.S;
		regs._DB = msg.regs.DB;
		regs._DP = msg.regs.DP;
		regs._PC = (msg.regs.pc_bank<<16)|msg.regs.pc_address;
		regs._P  = msg.regs.P;
		regs._WRAM = (msg.regs.wram_bank<<16)|msg.regs.wram_address;

		for (int bank=0; bank<256; bank++)
			memset(&regs._memory[bank*64*1024], 0, 0x8000);

		f.read(&regs._memory[0x7E0000], 1024*64);
		f.read(&regs._memory[0x7F0000], 1024*64);

		assert(msg.nmi == skip * nmi_per_skip);

		_current_nmi = msg.nmi;
		_trace_file.set_offset(msg.seek_offset_trace_file);

		_current_op = msg.current_op;
		_accumulated_op_counter = msg.current_op-1;

		read_next_event();

		#ifdef VERIFY_OPS
			if (_trace_helper._file) {
				uint64_t helper_pos = _current_op * (sizeof(snestistics::HelperType)+sizeof(snestistics::HelperOp));
				_trace_helper.set_offset(helper_pos);
			}
		#endif
		fclose(f._file);
	} while (false);

	CUSTOM_ASSERT(_current_nmi <= target_skip_nmi);

	if (_current_nmi == target_skip_nmi) // We had a skip for the exact right nmi
		return true;

	// TODO: We might have to re-emulate from start if there was no skip and we want to go to same frame or less
	// Skips are not for every nmi so make sure we reach the right one
	while (true) {
		if (target_skip_nmi == _current_nmi && _current_op == _next_event_op && _next_event.type == TraceEventType::EVENT_NMI)
			return true;
		if (!next())
			return false;
	}
}